

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O0

uint32_t duckdb_apache::thrift::protocol::
         skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>>
                   (TCompactProtocolT<duckdb::SimpleReadTransport> *prot,TType type)

{
  uint32_t uVar1;
  undefined8 uVar2;
  undefined4 in_ESI;
  TCompactProtocolT<duckdb::SimpleReadTransport> *in_RDI;
  uint32_t size_2;
  uint32_t i_2;
  TType elemType_1;
  uint32_t result_3;
  uint32_t size_1;
  uint32_t i_1;
  TType elemType;
  uint32_t result_2;
  uint32_t size;
  uint32_t i;
  TType valType;
  TType keyType;
  uint32_t result_1;
  TType ftype;
  int16_t fid;
  string name;
  uint32_t result;
  string str;
  double dub;
  int64_t i64;
  int32_t i32;
  int16_t i16;
  int8_t bytev;
  bool boolv;
  TInputRecursionTracker tracker;
  TProtocol *in_stack_fffffffffffffe88;
  TCompactProtocolT<duckdb::SimpleReadTransport> *in_stack_fffffffffffffe90;
  string *message;
  undefined4 in_stack_fffffffffffffe98;
  TProtocolExceptionType in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  string *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  TCompactProtocolT<duckdb::SimpleReadTransport> *in_stack_fffffffffffffed0;
  undefined1 local_f9 [37];
  uint local_d4;
  uint local_d0;
  uint32_t local_c8;
  uint local_c4;
  uint local_c0;
  uint32_t local_b8;
  uint local_b4;
  uint local_b0;
  uint32_t local_a4;
  int local_a0;
  string local_98 [36];
  uint32_t local_74;
  string local_70 [55];
  undefined1 local_39;
  undefined4 local_38;
  TType in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint32_t local_4;
  
  TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  switch(in_ESI) {
  case 2:
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readBool
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (bool *)in_stack_fffffffffffffe90);
    local_38 = 1;
    break;
  case 3:
    local_39 = 0;
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readByte
                        (in_stack_fffffffffffffe90,(int8_t *)in_stack_fffffffffffffe88);
    local_38 = 1;
    break;
  case 4:
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readDouble
                        (in_stack_fffffffffffffe90,(double *)in_stack_fffffffffffffe88);
    local_38 = 1;
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x30);
    message = (string *)local_f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_f9 + 1),"invalid TType",(allocator *)message);
    TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c,message);
    __cxa_throw(uVar2,&TProtocolException::typeinfo,TProtocolException::~TProtocolException);
  case 6:
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readI16
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (int16_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_38 = 1;
    break;
  case 8:
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readI32
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (int32_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_38 = 1;
    break;
  case 10:
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readI64
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (int64_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_38 = 1;
    break;
  case 0xb:
    std::__cxx11::string::string(local_70);
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readBinary
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         in_stack_fffffffffffffec0);
    local_38 = 1;
    std::__cxx11::string::~string(local_70);
    break;
  case 0xc:
    local_74 = 0;
    std::__cxx11::string::string(local_98);
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readStructBegin
                      (in_stack_fffffffffffffe90,(string *)in_stack_fffffffffffffe88);
    local_74 = uVar1 + local_74;
    while( true ) {
      uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readFieldBegin
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         (string *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                         (TType *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (int16_t *)in_stack_fffffffffffffe90);
      local_74 = uVar1 + local_74;
      if (local_a0 == 0) break;
      uVar1 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>>
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
      local_74 = uVar1 + local_74;
      uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readFieldEnd(in_RDI);
      local_74 = uVar1 + local_74;
    }
    local_4 = TCompactProtocolT<duckdb::SimpleReadTransport>::readStructEnd
                        (in_stack_fffffffffffffe90);
    local_4 = local_4 + local_74;
    local_38 = 1;
    local_74 = local_4;
    std::__cxx11::string::~string(local_98);
    break;
  case 0xd:
    local_a4 = 0;
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readMapBegin
                      (in_stack_fffffffffffffed0,
                       (TType *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (TType *)in_stack_fffffffffffffec0,
                       (uint32_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_a4 = uVar1 + local_a4;
    for (local_b0 = 0; local_b0 < local_b4; local_b0 = local_b0 + 1) {
      uVar1 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>>
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
      local_a4 = local_a4 + uVar1;
      uVar1 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>>
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
      local_a4 = uVar1 + local_a4;
    }
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readMapEnd(in_RDI);
    local_a4 = uVar1 + local_a4;
    local_38 = 1;
    local_4 = local_a4;
    break;
  case 0xe:
    local_b8 = 0;
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readSetBegin
                      (in_stack_fffffffffffffe90,(TType *)in_stack_fffffffffffffe88,
                       (uint32_t *)0x232a0e2);
    local_b8 = uVar1 + local_b8;
    for (local_c0 = 0; local_c0 < local_c4; local_c0 = local_c0 + 1) {
      uVar1 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>>
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
      local_b8 = uVar1 + local_b8;
    }
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readSetEnd(in_RDI);
    local_b8 = uVar1 + local_b8;
    local_38 = 1;
    local_4 = local_b8;
    break;
  case 0xf:
    local_c8 = 0;
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readListBegin
                      (in_stack_fffffffffffffed0,
                       (TType *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (uint32_t *)in_stack_fffffffffffffec0);
    local_c8 = uVar1 + local_c8;
    for (local_d0 = 0; local_d0 < local_d4; local_d0 = local_d0 + 1) {
      uVar1 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>>
                        ((TCompactProtocolT<duckdb::SimpleReadTransport> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4);
      local_c8 = uVar1 + local_c8;
    }
    uVar1 = TCompactProtocolT<duckdb::SimpleReadTransport>::readListEnd(in_RDI);
    local_c8 = uVar1 + local_c8;
    local_38 = 1;
    local_4 = local_c8;
  }
  TInputRecursionTracker::~TInputRecursionTracker((TInputRecursionTracker *)0x232a33a);
  return local_4;
}

Assistant:

uint32_t skip(Protocol_& prot, TType type) {
  TInputRecursionTracker tracker(prot);

  switch (type) {
  case T_BOOL: {
    bool boolv;
    return prot.readBool(boolv);
  }
  case T_BYTE: {
    int8_t bytev = 0;
    return prot.readByte(bytev);
  }
  case T_I16: {
    int16_t i16;
    return prot.readI16(i16);
  }
  case T_I32: {
    int32_t i32;
    return prot.readI32(i32);
  }
  case T_I64: {
    int64_t i64;
    return prot.readI64(i64);
  }
  case T_DOUBLE: {
    double dub;
    return prot.readDouble(dub);
  }
  case T_STRING: {
    std::string str;
    return prot.readBinary(str);
  }
  case T_STRUCT: {
    uint32_t result = 0;
    std::string name;
    int16_t fid;
    TType ftype;
    result += prot.readStructBegin(name);
    while (true) {
      result += prot.readFieldBegin(name, ftype, fid);
      if (ftype == T_STOP) {
        break;
      }
      result += skip(prot, ftype);
      result += prot.readFieldEnd();
    }
    result += prot.readStructEnd();
    return result;
  }
  case T_MAP: {
    uint32_t result = 0;
    TType keyType;
    TType valType;
    uint32_t i, size;
    result += prot.readMapBegin(keyType, valType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, keyType);
      result += skip(prot, valType);
    }
    result += prot.readMapEnd();
    return result;
  }
  case T_SET: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readSetBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readSetEnd();
    return result;
  }
  case T_LIST: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readListBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readListEnd();
    return result;
  }
  default:
    break;
  }

  throw TProtocolException(TProtocolException::INVALID_DATA,
                           "invalid TType");
}